

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O3

void __thiscall QMenuBar::mouseMoveEvent(QMenuBar *this,QMouseEvent *e)

{
  long lVar1;
  long *plVar2;
  QMenuBarPrivate *this_00;
  long lVar3;
  bool bVar4;
  int iVar5;
  QAction *action;
  bool popup;
  QPoint p;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  this_00 = *(QMenuBarPrivate **)&(this->super_QWidget).field_0x8;
  if (((byte)e[0x44] & 1) == 0) {
    this_00->field_0x298 = this_00->field_0x298 & 0xfe;
    iVar5 = QMouseEvent::source();
    if (iVar5 != 0) {
      return;
    }
  }
  popup = true;
  if ((this_00->field_0x2a0 & 1) == 0) {
    popup = (bool)(this_00->field_0x298 & 1);
  }
  auVar8 = QEventPoint::position();
  dVar7 = (double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._0_8_;
  bVar4 = 2147483647.0 < dVar7;
  if (dVar7 <= -2147483648.0) {
    dVar7 = -2147483648.0;
  }
  p.xp.m_i = (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar7);
  dVar7 = (double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._8_8_;
  bVar4 = 2147483647.0 < dVar7;
  if (dVar7 <= -2147483648.0) {
    dVar7 = -2147483648.0;
  }
  p.yp.m_i = (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar7);
  action = QMenuBarPrivate::actionAt(this_00,p);
  if (action != (QAction *)0x0) {
    lVar3 = (this_00->hiddenActions).d.size;
    if (lVar3 == 0) goto LAB_00466958;
    lVar6 = 0;
    do {
      if (lVar3 << 3 == lVar6) goto LAB_00466958;
      lVar1 = lVar6 + 8;
      plVar2 = (long *)((long)(this_00->hiddenActions).d.ptr + lVar6);
      lVar6 = lVar1;
    } while ((QAction *)*plVar2 != action);
    if (lVar1 == 0) goto LAB_00466958;
  }
  if (popup != false) {
    return;
  }
  popup = false;
LAB_00466958:
  QMenuBarPrivate::setCurrentAction(this_00,action,popup,false);
  return;
}

Assistant:

void QMenuBar::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QMenuBar);
    if (!(e->buttons() & Qt::LeftButton)) {
        d->mouseDown = false;
        // We receive mouse move and mouse press on touch.
        // Mouse move will open the menu and mouse press
        // will close it, so ignore mouse move.
        if (e->source() != Qt::MouseEventNotSynthesized)
            return;
    }

    bool popupState = d->popupState || d->mouseDown;
    QAction *action = d->actionAt(e->position().toPoint());
    if ((action && d->isVisible(action)) || !popupState)
        d->setCurrentAction(action, popupState);
}